

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int ffh_pairs(lua_State *L,MMS mm)

{
  TValue *o_00;
  cTValue *pcVar1;
  cTValue *mo;
  TValue *o;
  MMS mm_local;
  lua_State *L_local;
  
  o_00 = lj_lib_checkany(L,1);
  pcVar1 = lj_meta_lookup(L,o_00,mm);
  if (((int)(o_00->field_4).it >> 0xf == -0xb) && (pcVar1->u64 != 0xffffffffffffffff)) {
    L->top = o_00 + 1;
    L->base[-2] = *pcVar1;
    L_local._4_4_ = -1;
  }
  else {
    if ((int)(o_00->field_4).it >> 0xf != -0xc) {
      lj_err_argt(L,1,5);
    }
    o_00[-1].field_4 = *(anon_struct_8_2_7fa0a05d_for_TValue_4 *)o_00;
    o_00[-2].u64 = *(ulong *)((L->base[-2].u64 & 0x7fffffffffff) + 0x30) & 0x7fffffffffff |
                   0xfffb800000000000;
    if (mm == MM_pairs) {
      o_00->u64 = 0xffffffffffffffff;
    }
    else {
      o_00->u64 = 0;
    }
    L_local._4_4_ = 4;
  }
  return L_local._4_4_;
}

Assistant:

static int ffh_pairs(lua_State *L, MMS mm)
{
  TValue *o = lj_lib_checkany(L, 1);
  cTValue *mo = lj_meta_lookup(L, o, mm);
  if ((LJ_52 || tviscdata(o)) && !tvisnil(mo)) {
    L->top = o+1;  /* Only keep one argument. */
    copyTV(L, L->base-1-LJ_FR2, mo);  /* Replace callable. */
    return FFH_TAILCALL;
  } else {
    if (!tvistab(o)) lj_err_argt(L, 1, LUA_TTABLE);
    if (LJ_FR2) { copyTV(L, o-1, o); o--; }
    setfuncV(L, o-1, funcV(lj_lib_upvalue(L, 1)));
    if (mm == MM_pairs) setnilV(o+1); else setintV(o+1, 0);
    return FFH_RES(3);
  }
}